

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall gl4cts::GPUShaderFP64Test2::prepareShaderStages(GPUShaderFP64Test2 *this)

{
  value_type local_28 [6];
  GPUShaderFP64Test2 *local_10;
  GPUShaderFP64Test2 *this_local;
  
  local_10 = this;
  if (this->m_pDispatchCompute != (arbDispatchComputeFunc)0x0) {
    local_28[5] = 0;
    std::
    vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
    ::push_back(&this->m_shader_stages,local_28 + 5);
  }
  local_28[4] = 1;
  std::
  vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
  ::push_back(&this->m_shader_stages,local_28 + 4);
  local_28[3] = 2;
  std::
  vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
  ::push_back(&this->m_shader_stages,local_28 + 3);
  local_28[2] = 3;
  std::
  vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
  ::push_back(&this->m_shader_stages,local_28 + 2);
  local_28[1] = 4;
  std::
  vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
  ::push_back(&this->m_shader_stages,local_28 + 1);
  local_28[0] = VERTEX_SHADER;
  std::
  vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
  ::push_back(&this->m_shader_stages,local_28);
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareShaderStages()
{
	/* m_pDispatchCompute is initialized only if compute_shader are supproted and context is at least 4.2 */
	if (0 != m_pDispatchCompute)
	{
		m_shader_stages.push_back(COMPUTE_SHADER);
	}

	m_shader_stages.push_back(FRAGMENT_SHADER);
	m_shader_stages.push_back(GEOMETRY_SHADER);
	m_shader_stages.push_back(TESS_CTRL_SHADER);
	m_shader_stages.push_back(TESS_EVAL_SHADER);
	m_shader_stages.push_back(VERTEX_SHADER);
}